

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
smf::MidiMessage::intToVlv
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,int value)

{
  byte local_29;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25 [4];
  uchar byte5;
  uchar byte4;
  uchar byte3;
  uchar byte2;
  uchar byte1;
  byte local_16 [2];
  int local_14;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_10;
  int value_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *output;
  
  local_16[1] = 0;
  local_14 = value;
  pvStack_10 = __return_storage_ptr__;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  if (local_14 < 0x80) {
    local_16[0] = (byte)local_14;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,local_16);
  }
  else {
    local_25[0] = (byte)local_14 & 0x7f;
    local_26 = (byte)(local_14 >> 7) & 0x7f;
    local_27 = (byte)(local_14 >> 0xe) & 0x7f;
    local_28 = (byte)(local_14 >> 0x15) & 0x7f;
    local_29 = (byte)(local_14 >> 0x1c) & 0x7f;
    if (local_29 != 0) {
      local_28 = local_28 | 0x80;
    }
    if (local_28 != 0) {
      local_28 = local_28 | 0x80;
      local_27 = local_27 | 0x80;
    }
    if (local_27 != 0) {
      local_27 = local_27 | 0x80;
      local_26 = local_26 | 0x80;
    }
    if (local_26 != 0) {
      local_26 = local_26 | 0x80;
    }
    if (local_29 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_29);
    }
    if (local_28 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_28);
    }
    if (local_27 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_27);
    }
    if (local_26 != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (__return_storage_ptr__,&local_26);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,local_25);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uchar> MidiMessage::intToVlv(int value) {
	std::vector<uchar> output;
	if (value < 128) {
		output.push_back((uchar)value);
	} else {
		// calculate VLV bytes and insert into message
		uchar byte1 = value & 0x7f;
		uchar byte2 = (value >>  7) & 0x7f;
		uchar byte3 = (value >> 14) & 0x7f;
		uchar byte4 = (value >> 21) & 0x7f;
		uchar byte5 = (value >> 28) & 0x7f;
		if (byte5) {
			byte4 |= 0x80;
		}
		if (byte4) {
			byte4 |= 0x80;
			byte3 |= 0x80;
		}
		if (byte3) {
			byte3 |= 0x80;
			byte2 |= 0x80;
		}
		if (byte2) {
			byte2 |= 0x80;
		}
		if (byte5) { output.push_back(byte5); }
		if (byte4) { output.push_back(byte4); }
		if (byte3) { output.push_back(byte3); }
		if (byte2) { output.push_back(byte2); }
		output.push_back(byte1);
	}

	return output;
}